

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O0

char * vkt::tessellation::anon_unknown_2::getTessLevelsSSBODeclaration(void)

{
  return 
  "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n    float inner0;\n    float inner1;\n    float outer0;\n    float outer1;\n    float outer2;\n    float outer3;\n} sb_levels;\n"
  ;
}

Assistant:

inline const char* getTessLevelsSSBODeclaration (void)
{
	return	"layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
			"    float inner0;\n"
			"    float inner1;\n"
			"    float outer0;\n"
			"    float outer1;\n"
			"    float outer2;\n"
			"    float outer3;\n"
			"} sb_levels;\n";
}